

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subqueryref.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::SubqueryRef::Copy(SubqueryRef *this)

{
  pointer pSVar1;
  pointer pSVar2;
  type target;
  TableRef *in_RSI;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_30;
  __uniq_ptr_data<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true,_true>
  local_28;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_20;
  
  pSVar1 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)(in_RSI + 1));
  (*(pSVar1->super_SQLStatement)._vptr_SQLStatement[3])(&local_20,pSVar1);
  local_30._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (SelectStatement *)0x0;
  make_uniq<duckdb::SubqueryRef,duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>,std::__cxx11::string&>
            ((duckdb *)&local_28,
             (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              *)&local_30,&in_RSI->alias);
  if (local_30._M_head_impl != (SelectStatement *)0x0) {
    (*((local_30._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  local_30._M_head_impl = (SelectStatement *)0x0;
  if (local_20._M_head_impl != (SelectStatement *)0x0) {
    (*((local_20._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  local_20._M_head_impl = (SelectStatement *)0x0;
  pSVar2 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
           operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                       *)&local_28);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(pSVar2->super_TableRef).column_name_alias,
              &(in_RSI->column_name_alias).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  target = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
           operator*((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                      *)&local_28);
  TableRef::CopyProperties(in_RSI,&target->super_TableRef);
  (this->super_TableRef)._vptr_TableRef =
       (_func_int **)
       local_28.
       super___uniq_ptr_impl<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SubqueryRef_*,_std::default_delete<duckdb::SubqueryRef>_>.
       super__Head_base<0UL,_duckdb::SubqueryRef_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> SubqueryRef::Copy() {
	auto copy = make_uniq<SubqueryRef>(unique_ptr_cast<SQLStatement, SelectStatement>(subquery->Copy()), alias);
	copy->column_name_alias = column_name_alias;
	CopyProperties(*copy);
	return std::move(copy);
}